

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-bench.cpp
# Opt level: O2

string * join<int>(string *__return_storage_ptr__,vector<int,_std::allocator<int>_> *values,
                  string *delim)

{
  pointer piVar1;
  size_t i;
  ulong uVar2;
  ostringstream str;
  ostringstream local_1a0 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  for (uVar2 = 0;
      piVar1 = (values->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start,
      uVar2 < (ulong)((long)(values->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                            super__Vector_impl_data._M_finish - (long)piVar1 >> 2);
      uVar2 = uVar2 + 1) {
    std::ostream::operator<<((ostream *)local_1a0,piVar1[uVar2]);
    if (uVar2 < ((long)(values->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)(values->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_start >> 2) - 1U) {
      std::operator<<((ostream *)local_1a0,(string *)delim);
    }
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

static std::string join(const std::vector<T> & values, const std::string & delim) {
    std::ostringstream str;
    for (size_t i = 0; i < values.size(); i++) {
        str << values[i];
        if (i < values.size() - 1) {
            str << delim;
        }
    }
    return str.str();
}